

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O3

void __thiscall
randomx::AssemblyGeneratorX86::genAddressReg
          (AssemblyGeneratorX86 *this,Instruction *instr,char *reg)

{
  char *__s;
  size_t sVar1;
  ostream *poVar2;
  long *plVar3;
  undefined1 *this_00;
  int iVar4;
  
  this_00 = &this->field_0x10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\tlea ",5);
  if (reg == (char *)0x0) {
    std::ios::clear((int)this_00 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
  }
  else {
    sVar1 = strlen(reg);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,reg,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", [",3);
  __s = *(char **)(regR32 + (ulong)instr->src * 8);
  sVar1 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,__s,sVar1);
  *(uint *)(&this->field_0x28 + *(long *)(*(long *)this_00 + -0x18)) =
       *(uint *)(&this->field_0x28 + *(long *)(*(long *)this_00 + -0x18)) | 0x800;
  poVar2 = (ostream *)std::ostream::operator<<(this_00,instr->imm32);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xfffff7ff;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\tand ",5);
  if (reg == (char *)0x0) {
    std::ios::clear((int)this_00 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
  }
  else {
    sVar1 = strlen(reg);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,reg,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
  iVar4 = 0x3ff8;
  if ((instr->mod & 3) == 0) {
    iVar4 = 0x3fff8;
  }
  plVar3 = (long *)std::ostream::operator<<(this_00,iVar4);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  return;
}

Assistant:

void AssemblyGeneratorX86::genAddressReg(Instruction& instr, const char* reg = "eax") {
		asmCode << "\tlea " << reg << ", [" << regR32[instr.src] << std::showpos << (int32_t)instr.getImm32() << std::noshowpos << "]" << std::endl;
		asmCode << "\tand " << reg << ", " << ((instr.getModMem()) ? ScratchpadL1Mask : ScratchpadL2Mask) << std::endl;
	}